

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O1

void __thiscall TextReader::parse_hex(TextReader *this)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  size_t sVar5;
  ulong uVar6;
  _Alloc_hider _Var7;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool bVar10;
  string local_58;
  string local_38;
  
  uVar3 = (this->current_line_)._M_string_length;
  sVar5 = this->current_token_len_ + 2;
  this->current_token_len_ = sVar5;
  uVar6 = this->current_token_pos_ + sVar5;
  bVar10 = uVar6 < uVar3;
  if (bVar10) {
    pcVar4 = (this->current_line_)._M_dataplus._M_p;
    do {
      bVar1 = pcVar4[uVar6];
      if ((9 < (byte)(bVar1 - 0x30)) &&
         ((uVar8 = bVar1 - 0x41, 0x25 < uVar8 || ((0x3f0000003fU >> ((ulong)uVar8 & 0x3f) & 1) == 0)
          ))) {
        if (bVar10) {
          cVar2 = (this->current_line_)._M_dataplus._M_p[uVar6];
          if (((byte)(cVar2 + 0xbfU) < 0x1a || (byte)(cVar2 - 0x30U) < 10) ||
             (cVar2 == '_' || (byte)(cVar2 + 0x9fU) < 0x1a)) {
            paVar9 = &local_38.field_2;
            local_38._M_dataplus._M_p = (pointer)paVar9;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_38,"Invalid symbol in hexadecimal value","");
            parse_error(this,&local_38);
            _Var7._M_p = local_38._M_dataplus._M_p;
            goto LAB_0010b634;
          }
        }
        break;
      }
      sVar5 = sVar5 + 1;
      this->current_token_len_ = sVar5;
      uVar6 = uVar6 + 1;
      bVar10 = uVar6 < uVar3;
    } while (bVar10);
  }
  if (sVar5 == 2) {
    paVar9 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Hexadecimal value prefix specified without the value","");
    parse_error(this,&local_58);
    _Var7._M_p = local_58._M_dataplus._M_p;
LAB_0010b634:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != paVar9) {
      operator_delete(_Var7._M_p);
    }
  }
  return;
}

Assistant:

inline void parse_hex() {
        current_token_len_++;
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_hex_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_HEX_INVALID_SYMBOL);
        } else if (current_token_len_ == 2) {
            parse_error(ERROR_MISSING_HEX_VALUE);
        };
    }